

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O3

void __thiscall Memory::PagePool::ReleaseFreePages(PagePool *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  PagePoolFreePage *pPVar4;
  PagePoolFreePage *address;
  undefined8 *in_FS_OFFSET;
  
  address = this->freePageList;
  if (address != (PagePoolFreePage *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      pPVar4 = address;
      if ((address->super_PagePoolPage).isReserved == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,0x93,"(!page->IsReserved())","!page->IsReserved()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
        pPVar4 = this->freePageList;
      }
      this->freePageList = pPVar4->nextFreePage;
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReleasePages((address->super_PagePoolPage).pageAllocator,address,1,
                     (address->super_PagePoolPage).pageSegment);
      address = this->freePageList;
    } while (address != (PagePoolFreePage *)0x0);
  }
  return;
}

Assistant:

void ReleaseFreePages()
    {
        while (freePageList != nullptr)
        {
            PagePoolFreePage * page = freePageList;
            Assert(!page->IsReserved());
            freePageList = freePageList->nextFreePage;
            page->Free();
        }
    }